

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void gola_fixup(LexState *ls,FuncScope *bl)

{
  uint8_t *puVar1;
  uint uVar2;
  uint list;
  FuncState *fs;
  VarInfo *pVVar3;
  byte bVar4;
  VarInfo *pVVar5;
  VarInfo *pVVar6;
  VarInfo *pVVar7;
  
  if (bl->vstart < ls->vtop) {
    pVVar7 = ls->vstack + ls->vtop;
    pVVar6 = ls->vstack + bl->vstart;
    do {
      uVar2 = (pVVar6->name).gcptr32;
      if ((ulong)uVar2 != 0) {
        if ((pVVar6->info & 4) == 0) {
          if ((pVVar6->info & 2) != 0) {
            if (bl->prev == (FuncScope *)0x0) {
              ls->linenumber = ls->fs->bcbase[pVVar6->startpc].line;
              if (uVar2 != 1) {
                lj_lex_error(ls,0,LJ_ERR_XLUNDEF,(ulong)uVar2 + 0x10);
              }
              lj_lex_error(ls,0,LJ_ERR_XBREAK);
            }
            puVar1 = &bl->prev->flags;
            *puVar1 = *puVar1 | (uVar2 != 1) * '\x02' + 2U;
            pVVar6->slot = bl->nactvar;
            if ((bl->flags & 8) != 0) {
              gola_close((LexState *)ls->fs,(VarInfo *)(ulong)pVVar6->startpc);
            }
          }
        }
        else {
          (pVVar6->name).gcptr32 = 0;
          pVVar5 = pVVar6;
          while (pVVar3 = pVVar5, pVVar5 = pVVar3 + 1, pVVar5 < pVVar7) {
            if (((pVVar5->name).gcptr32 == uVar2) && ((pVVar3[1].info & 2) != 0)) {
              bVar4 = pVVar6->slot;
              if (((bl->flags & 8) != 0) && (bVar4 < pVVar3[1].slot)) {
                gola_close((LexState *)ls->fs,(VarInfo *)(ulong)pVVar3[1].startpc);
                bVar4 = pVVar6->slot;
              }
              fs = ls->fs;
              list = pVVar3[1].startpc;
              (pVVar5->name).gcptr32 = 0;
              *(byte *)((long)&fs->bcbase[list].ins + 1) = bVar4;
              jmp_patch(fs,list,pVVar6->startpc);
            }
          }
        }
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 < pVVar7);
  }
  return;
}

Assistant:

static void gola_fixup(LexState *ls, FuncScope *bl)
{
  VarInfo *v = ls->vstack + bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++) {
    GCstr *name = strref(v->name);
    if (name != NULL) {  /* Only consider remaining valid gotos/labels. */
      if (gola_islabel(v)) {
	VarInfo *vg;
	setgcrefnull(v->name);  /* Invalidate label that goes out of scope. */
	for (vg = v+1; vg < ve; vg++)  /* Resolve pending backward gotos. */
	  if (strref(vg->name) == name && gola_isgoto(vg)) {
	    if ((bl->flags&FSCOPE_UPVAL) && vg->slot > v->slot)
	      gola_close(ls, vg);
	    gola_patch(ls, vg, v);
	  }
      } else if (gola_isgoto(v)) {
	if (bl->prev) {  /* Propagate goto or break to outer scope. */
	  bl->prev->flags |= name == NAME_BREAK ? FSCOPE_BREAK : FSCOPE_GOLA;
	  v->slot = bl->nactvar;
	  if ((bl->flags & FSCOPE_UPVAL))
	    gola_close(ls, v);
	} else {  /* No outer scope: undefined goto label or no loop. */
	  ls->linenumber = ls->fs->bcbase[v->startpc].line;
	  if (name == NAME_BREAK)
	    lj_lex_error(ls, 0, LJ_ERR_XBREAK);
	  else
	    lj_lex_error(ls, 0, LJ_ERR_XLUNDEF, strdata(name));
	}
      }
    }
  }
}